

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

size_t __thiscall Memory::check_memory(Memory *this,char *start,char *end)

{
  pointer pBVar1;
  size_t sVar2;
  undefined1 local_1480 [8];
  PatternAddressMapper pattern_mapping;
  
  pBVar1 = (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar1) {
    (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar1;
  }
  PatternAddressMapper::PatternAddressMapper((PatternAddressMapper *)local_1480);
  sVar2 = check_memory_internal(this,(PatternAddressMapper *)local_1480,start,end,false,true);
  PatternAddressMapper::~PatternAddressMapper((PatternAddressMapper *)local_1480);
  return sVar2;
}

Assistant:

size_t Memory::check_memory(const volatile char *start, const volatile char *end) {
  flipped_bits.clear();
  // create a "fake" pattern mapping to keep this method for backward compatibility
  PatternAddressMapper pattern_mapping;
  return check_memory_internal(pattern_mapping, start, end, false, true);
}